

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode
UA_Connection_completeMessages
          (UA_Connection *connection,UA_ByteString *message,UA_Boolean *realloced)

{
  uint uVar1;
  size_t sVar2;
  bool bVar3;
  uint3 uVar4;
  UA_ByteString *pUVar5;
  UA_StatusCode UVar6;
  UA_Byte *pUVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  ulong __size;
  size_t local_50;
  size_t length_pos;
  uint local_3c;
  UA_ByteString *pUStack_38;
  UA_UInt32 chunk_length;
  
  pUStack_38 = &connection->incompleteMessage;
  sVar2 = (connection->incompleteMessage).length;
  if (sVar2 != 0) {
    sVar10 = sVar2 + message->length;
    pUVar7 = (UA_Byte *)realloc((connection->incompleteMessage).data,sVar10);
    if (pUVar7 != (UA_Byte *)0x0) {
      memcpy(pUVar7 + (connection->incompleteMessage).length,message->data,message->length);
      (*connection->releaseRecvBuffer)(connection,message);
      message->data = pUVar7;
      message->length = sVar10;
      *realloced = true;
      pUStack_38->length = 0;
      pUStack_38->data = (UA_Byte *)0x0;
      goto LAB_00113a53;
    }
LAB_00113bce:
    UVar6 = 0x80030000;
    goto LAB_00113bd4;
  }
LAB_00113a53:
  __size = message->length;
  uVar9 = 0;
  length_pos = (size_t)realloced;
  if (__size < 8) {
    bVar3 = false;
  }
  else {
    do {
      uVar4 = CONCAT12(message->data[uVar9 + 2],*(undefined2 *)(message->data + uVar9));
      if (uVar4 < 0x4e504f) {
        if (((uVar4 != 0x47534d) && (uVar4 != 0x4b4341)) && (uVar4 != 0x4c4548)) {
LAB_00113c10:
          if (uVar9 == __size) {
            return 0;
          }
          goto LAB_00113b2a;
        }
      }
      else if (((uVar4 != 0x4e504f) && (uVar4 != 0x525245)) && (uVar4 != 0x4f4c43))
      goto LAB_00113c10;
      local_3c = 0;
      local_50 = uVar9 + 4;
      UVar6 = UA_decodeBinary(message,&local_50,&local_3c,UA_TYPES + 6);
      if ((UVar6 != 0) || (local_3c < 0x10)) {
        __size = message->length;
        bVar3 = true;
        goto LAB_00113b1e;
      }
      __size = message->length;
      uVar1 = (connection->localConf).recvBufferSize;
      bVar3 = uVar1 < local_3c;
      if (uVar1 < local_3c) goto LAB_00113b1e;
      uVar8 = local_3c + uVar9;
      if (__size < uVar8) goto LAB_00113b1e;
      uVar9 = uVar8;
    } while (7 < __size - uVar8);
    bVar3 = false;
  }
LAB_00113b1e:
  realloced = (UA_Boolean *)length_pos;
  sVar10 = __size - uVar9;
  if (sVar10 == 0) {
LAB_00113b6e:
    UVar6 = 0;
  }
  else {
    if (bVar3) {
LAB_00113b2a:
      if (uVar9 != 0) {
LAB_00113b6b:
        message->length = uVar9;
        goto LAB_00113b6e;
      }
      UVar6 = 0;
      realloced = (UA_Boolean *)length_pos;
    }
    else {
      if (uVar9 == 0) {
        if (*(char *)length_pos == '\0') {
          pUStack_38->length = 0;
          pUStack_38->data = (UA_Byte *)0x0;
          if (__size == 0) {
            pUVar7 = (UA_Byte *)0x0;
LAB_00113c20:
            memcpy(pUVar7,message->data,message->length);
            (*connection->releaseRecvBuffer)(connection,message);
            *realloced = true;
            return 0;
          }
          pUVar7 = (UA_Byte *)malloc(__size);
          (connection->incompleteMessage).data = pUVar7;
          if (pUVar7 != (UA_Byte *)0x0) {
            pUStack_38->length = __size;
            goto LAB_00113c20;
          }
          goto LAB_00113bce;
        }
        pUVar7 = message->data;
        pUStack_38->length = message->length;
        pUStack_38->data = pUVar7;
        message->length = 0;
        message->data = (UA_Byte *)0x0;
        goto LAB_00113b6e;
      }
      (connection->incompleteMessage).length = 0;
      pUVar7 = (UA_Byte *)malloc(sVar10);
      (connection->incompleteMessage).data = pUVar7;
      if (pUVar7 != (UA_Byte *)0x0) {
        pUStack_38->length = sVar10;
        memcpy(pUVar7,message->data + uVar9,sVar10);
        goto LAB_00113b6b;
      }
      UVar6 = 0x80030000;
      realloced = (UA_Boolean *)length_pos;
    }
LAB_00113bd4:
    if (*realloced == false) {
      (*connection->releaseRecvBuffer)(connection,message);
    }
    pUVar5 = pUStack_38;
    deleteMembers_noInit(pUStack_38,UA_TYPES + 0xe);
    pUVar5->length = 0;
    pUVar5->data = (UA_Byte *)0x0;
  }
  return UVar6;
}

Assistant:

UA_StatusCode
UA_Connection_completeMessages(UA_Connection *connection, UA_ByteString *message,
                               UA_Boolean *realloced) {
    UA_StatusCode retval = UA_STATUSCODE_GOOD;

    /* We have a stored an incomplete chunk. Concat the received message to the end.
     * After this block, connection->incompleteMessage is always empty. */
    if(connection->incompleteMessage.length > 0) {
        size_t length = connection->incompleteMessage.length + message->length;
        UA_Byte *data = (UA_Byte*)UA_realloc(connection->incompleteMessage.data, length);
        if(!data) {
            retval = UA_STATUSCODE_BADOUTOFMEMORY;
            goto cleanup;
        }
        memcpy(&data[connection->incompleteMessage.length], message->data, message->length);
        connection->releaseRecvBuffer(connection, message);
        message->data = data;
        message->length = length;
        *realloced = true;
        connection->incompleteMessage = UA_BYTESTRING_NULL;
    }

    /* Loop over the chunks in the received buffer */
    size_t complete_until = 0; /* the received complete chunks end at this point */
    UA_Boolean garbage_end = false; /* garbage after the last complete message */
    while(message->length - complete_until >= 8) {
        /* Check the message type */
        UA_UInt32 msgtype = (UA_UInt32)message->data[complete_until] +
            ((UA_UInt32)message->data[complete_until+1] << 8) +
            ((UA_UInt32)message->data[complete_until+2] << 16);
        if(msgtype != ('M' + ('S' << 8) + ('G' << 16)) &&
           msgtype != ('E' + ('R' << 8) + ('R' << 16)) &&
           msgtype != ('O' + ('P' << 8) + ('N' << 16)) &&
           msgtype != ('H' + ('E' << 8) + ('L' << 16)) &&
           msgtype != ('A' + ('C' << 8) + ('K' << 16)) &&
           msgtype != ('C' + ('L' << 8) + ('O' << 16))) {
            garbage_end = true; /* the message type is not recognized */
            break;
        }

        /* Decode the length of the chunk */
        UA_UInt32 chunk_length = 0;
        size_t length_pos = complete_until + 4;
        UA_StatusCode decode_retval = UA_UInt32_decodeBinary(message, &length_pos, &chunk_length);

        /* The message size is not allowed. Throw the remaining bytestring away */
        if(decode_retval != UA_STATUSCODE_GOOD ||
           chunk_length < 16 ||
           chunk_length > connection->localConf.recvBufferSize) {
            garbage_end = true;
            break;
        }

        /* The chunk is okay but incomplete. Store the end. */
        if(chunk_length + complete_until > message->length)
            break;

        complete_until += chunk_length; /* Go to the next chunk */
    }

    /* Separate incomplete chunks */
    if(complete_until != message->length) {
        /* Garbage after the last good chunk. No need to keep a buffer */
        if(garbage_end) {
            if(complete_until == 0)
                goto cleanup; /* All garbage, only happens on messages from the network layer */
            message->length = complete_until;
            return UA_STATUSCODE_GOOD;
        }

        /* No good chunk, only an incomplete one */
        if(complete_until == 0) {
            if(!*realloced) {
                retval = UA_ByteString_allocBuffer(&connection->incompleteMessage, message->length);
                if(retval != UA_STATUSCODE_GOOD)
                    goto cleanup;
                memcpy(connection->incompleteMessage.data, message->data, message->length);
                connection->releaseRecvBuffer(connection, message);
                *realloced = true;
            } else {
                connection->incompleteMessage = *message;
                *message = UA_BYTESTRING_NULL;
            }
            return UA_STATUSCODE_GOOD;
        }

        /* At least one good chunk and an incomplete one */
        size_t incomplete_length = message->length - complete_until;
        retval = UA_ByteString_allocBuffer(&connection->incompleteMessage, incomplete_length);
        if(retval != UA_STATUSCODE_GOOD)
            goto cleanup;
        memcpy(connection->incompleteMessage.data,
               &message->data[complete_until], incomplete_length);
        message->length = complete_until;
    }

    return UA_STATUSCODE_GOOD;

 cleanup:
    if(!*realloced)
        connection->releaseRecvBuffer(connection, message);
    UA_ByteString_deleteMembers(&connection->incompleteMessage);
    return retval;
}